

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cc
# Opt level: O0

void __thiscall
leveldb::Status_MoveConstructor_Test::Status_MoveConstructor_Test(Status_MoveConstructor_Test *this)

{
  Status_MoveConstructor_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Status_MoveConstructor_Test_00177f50;
  return;
}

Assistant:

TEST(Status, MoveConstructor) {
  {
    Status ok = Status::OK();
    Status ok2 = std::move(ok);

    ASSERT_TRUE(ok2.ok());
  }

  {
    Status status = Status::NotFound("custom NotFound status message");
    Status status2 = std::move(status);

    ASSERT_TRUE(status2.IsNotFound());
    ASSERT_EQ("NotFound: custom NotFound status message", status2.ToString());
  }

  {
    Status self_moved = Status::IOError("custom IOError status message");

    // Needed to bypass compiler warning about explicit move-assignment.
    Status& self_moved_reference = self_moved;
    self_moved_reference = std::move(self_moved);
  }
}